

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void utf8_suite::test_F0_BF_BF_BF(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined4 local_14c;
  value local_148 [2];
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [7];
  
  decoder.current.scan._260_3_ = 0x22bf;
  decoder.current.scan._256_4_ = 0xbfbff022;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<7ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [7])((long)&decoder.current.scan + 0x100));
  local_148[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_14c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x818,"void utf8_suite::test_F0_BF_BF_BF()",local_148,&local_14c);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_170,(basic_decoder<char> *)local_140);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[5]>
            ("decoder.string_value<std::string>()","\"\\xF0\\xBF\\xBF\\xBF\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x819,"void utf8_suite::test_F0_BF_BF_BF()",&local_170,anon_var_dwarf_6e4a);
  std::__cxx11::string::~string((string *)&local_170);
  return;
}

Assistant:

void test_F0_BF_BF_BF()
{
    const char input[] = "\"\xF0\xBF\xBF\xBF\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "\xF0\xBF\xBF\xBF");
}